

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::json_value::destroy(json_value *this,value_t t)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar1;
  _Rep_type *p_Var2;
  pointer pbVar3;
  json_value jVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  uint uVar11;
  ulong uVar12;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  stack;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  current_item;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  ulong local_40;
  json_value *local_38;
  
  uVar12 = CONCAT71(in_register_00000031,t) & 0xffffffff;
  uVar11 = (uint)CONCAT71(in_register_00000031,t);
  if ((byte)(t - object) < 2) {
    local_68.
    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_68.
    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_68.
    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    plVar8 = *(long **)this;
    if ((char)uVar12 == '\x02') {
      std::
      vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::reserve(&local_68,plVar8[1] - *plVar8 >> 4);
      pbVar10 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)**(long **)this;
      lVar9 = (*(long **)this)[1] - (long)pbVar10 >> 4;
      if (0 < lVar9) {
        lVar9 = lVar9 + 1;
        do {
          std::
          vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::
          emplace_back<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&local_68,pbVar10);
          pbVar10 = pbVar10 + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
    }
    else {
      std::
      vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::reserve(&local_68,plVar8[5]);
      lVar9 = *(long *)this;
      for (p_Var5 = *(_Rb_tree_node_base **)(lVar9 + 0x18);
          p_Var5 != (_Rb_tree_node_base *)(lVar9 + 8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::
        vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        emplace_back<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_68,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)(p_Var5 + 2));
      }
    }
    local_40 = uVar12;
    local_38 = this;
    if (local_68.
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pbVar3 = local_68.
                 super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_50.m_type =
             local_68.
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].m_type;
        local_50.m_value =
             (json_value)
             local_68.
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].m_value.binary;
        assert_invariant(local_68.
                         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,false);
        pbVar3[-1].m_type = null;
        pbVar3[-1].m_value.object = (object_t *)0x0;
        assert_invariant(&local_50,true);
        local_68.
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        ~basic_json(local_68.
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        if (local_50.m_type == object) {
          p_Var2 = &(local_50.m_value.object)->_M_t;
          for (p_Var5 = (_Rb_tree_node_base *)(local_50.m_value.binary)->m_subtype;
              (_Rb_tree_header *)p_Var5 != &(p_Var2->_M_impl).super__Rb_tree_header;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            std::
            vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::
            emplace_back<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                        *)&local_68,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(p_Var5 + 2));
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::clear(&(local_50.m_value.object)->_M_t);
        }
        else if (local_50.m_type == array) {
          pbVar10 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      **)&(local_50.m_value.array)->
                          super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ;
          lVar9 = *(long *)&(((_Rb_tree_impl<std::less<void>,_true> *)
                             &(local_50.m_value.array)->
                              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )->super__Rb_tree_header)._M_header - (long)pbVar10 >> 4;
          if (0 < lVar9) {
            lVar9 = lVar9 + 1;
            do {
              std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::
              emplace_back<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                          *)&local_68,pbVar10);
              pbVar10 = pbVar10 + 1;
              lVar9 = lVar9 + -1;
            } while (1 < lVar9);
          }
          jVar4 = local_50.m_value;
          pbVar10 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      **)&(local_50.m_value.array)->
                          super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ;
          pbVar1 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     **)&(((_Rb_tree_impl<std::less<void>,_true> *)
                          &(local_50.m_value.array)->
                           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          )->super__Rb_tree_header)._M_header;
          this_00 = pbVar10;
          if (pbVar1 != pbVar10) {
            do {
              ~basic_json(this_00);
              this_00 = this_00 + 1;
            } while (this_00 != pbVar1);
            *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              **)&(((_Rb_tree_impl<std::less<void>,_true> *)
                   &(jVar4.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   )->super__Rb_tree_header)._M_header = pbVar10;
          }
        }
        ~basic_json(&local_50);
      } while (local_68.
               super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_68.
               super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&local_68);
    uVar11 = (uint)local_40;
    this = local_38;
  }
  switch(uVar11 & 0xff) {
  case 1:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::~_Rb_tree(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  **)this);
    uVar12 = 0x30;
    break;
  case 2:
    std::
    vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(*(vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                **)this);
    uVar12 = 0x18;
    break;
  case 3:
    plVar8 = (long *)**(long **)this;
    plVar6 = *(long **)this + 2;
    uVar12 = 0x20;
    if (plVar8 != plVar6) {
      uVar7 = *plVar6 + 1;
LAB_001cbf5c:
      operator_delete(plVar8,uVar7);
    }
    break;
  default:
    goto switchD_001cbf05_caseD_4;
  case 8:
    plVar8 = (long *)**(long **)this;
    uVar12 = 0x28;
    if (plVar8 != (long *)0x0) {
      uVar7 = (*(long **)this)[2] - (long)plVar8;
      goto LAB_001cbf5c;
    }
  }
  operator_delete(*(void **)this,uVar12);
switchD_001cbf05_caseD_4:
  return;
}

Assistant:

void destroy(value_t t)
        {
            if (t == value_t::array || t == value_t::object)
            {
                // flatten the current json_value to a heap-allocated stack
                std::vector<basic_json> stack;

                // move the top-level items to stack
                if (t == value_t::array)
                {
                    stack.reserve(array->size());
                    std::move(array->begin(), array->end(), std::back_inserter(stack));
                }
                else
                {
                    stack.reserve(object->size());
                    for (auto&& it : *object)
                    {
                        stack.push_back(std::move(it.second));
                    }
                }

                while (!stack.empty())
                {
                    // move the last item to local variable to be processed
                    basic_json current_item(std::move(stack.back()));
                    stack.pop_back();

                    // if current_item is array/object, move
                    // its children to the stack to be processed later
                    if (current_item.is_array())
                    {
                        std::move(current_item.m_value.array->begin(), current_item.m_value.array->end(), std::back_inserter(stack));

                        current_item.m_value.array->clear();
                    }
                    else if (current_item.is_object())
                    {
                        for (auto&& it : *current_item.m_value.object)
                        {
                            stack.push_back(std::move(it.second));
                        }

                        current_item.m_value.object->clear();
                    }

                    // it's now safe that current_item get destructed
                    // since it doesn't have any children
                }
            }

            switch (t)
            {
                case value_t::object:
                {
                    AllocatorType<object_t> alloc;
                    std::allocator_traits<decltype(alloc)>::destroy(alloc, object);
                    std::allocator_traits<decltype(alloc)>::deallocate(alloc, object, 1);
                    break;
                }

                case value_t::array:
                {
                    AllocatorType<array_t> alloc;
                    std::allocator_traits<decltype(alloc)>::destroy(alloc, array);
                    std::allocator_traits<decltype(alloc)>::deallocate(alloc, array, 1);
                    break;
                }

                case value_t::string:
                {
                    AllocatorType<string_t> alloc;
                    std::allocator_traits<decltype(alloc)>::destroy(alloc, string);
                    std::allocator_traits<decltype(alloc)>::deallocate(alloc, string, 1);
                    break;
                }

                case value_t::binary:
                {
                    AllocatorType<binary_t> alloc;
                    std::allocator_traits<decltype(alloc)>::destroy(alloc, binary);
                    std::allocator_traits<decltype(alloc)>::deallocate(alloc, binary, 1);
                    break;
                }

                case value_t::null:
                case value_t::boolean:
                case value_t::number_integer:
                case value_t::number_unsigned:
                case value_t::number_float:
                case value_t::discarded:
                default:
                {
                    break;
                }
            }
        }